

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lattices.cpp
# Opt level: O0

void __thiscall ValTypeLattice_Join_Test::TestBody(ValTypeLattice_Join_Test *this)

{
  HeapType local_78;
  Type local_70;
  HeapType local_68;
  Type local_60;
  HeapType local_58;
  Type local_50;
  HeapType local_48;
  Type local_40;
  Type local_38;
  Type local_30;
  Type local_28;
  Type local_20;
  ValType local_11;
  ValTypeLattice_Join_Test *pVStack_10;
  ValType valtype;
  ValTypeLattice_Join_Test *this_local;
  
  pVStack_10 = this;
  ::wasm::Type::Type(&local_20,unreachable);
  ::wasm::Type::Type(&local_28,i32);
  ::wasm::Type::Type(&local_30,f32);
  ::wasm::Type::Type(&local_38,none);
  testDiamondJoin<wasm::analysis::ValType>(&local_11,&local_20,&local_28,&local_30,&local_38);
  ::wasm::HeapType::HeapType(&local_48,none);
  ::wasm::Type::Type(&local_40,local_48,NonNullable,Inexact);
  ::wasm::HeapType::HeapType(&local_58,struct_);
  ::wasm::Type::Type(&local_50,local_58,NonNullable,Inexact);
  ::wasm::HeapType::HeapType(&local_68,array);
  ::wasm::Type::Type(&local_60,local_68,Nullable,Inexact);
  ::wasm::HeapType::HeapType(&local_78,eq);
  ::wasm::Type::Type(&local_70,local_78,Nullable,Inexact);
  testDiamondJoin<wasm::analysis::ValType>(&local_11,&local_40,&local_50,&local_60,&local_70);
  return;
}

Assistant:

TEST(ValTypeLattice, Join) {
  analysis::ValType valtype;
  testDiamondJoin(valtype, Type::unreachable, Type::i32, Type::f32, Type::none);
  testDiamondJoin(valtype,
                  Type(HeapType::none, NonNullable),
                  Type(HeapType::struct_, NonNullable),
                  Type(HeapType::array, Nullable),
                  Type(HeapType::eq, Nullable));
}